

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclWorker.cpp
# Opt level: O2

void __thiscall xmrig::OclWorker::OclWorker(OclWorker *this,size_t id,OclLaunchData *data)

{
  OclSharedData *pOVar1;
  OclCnRunner *this_00;
  
  Worker::Worker(&this->super_Worker,id,data->affinity,-1);
  (this->super_Worker).super_IWorker._vptr_IWorker = (_func_int **)&PTR__OclWorker_001bc198;
  this->m_miner = data->miner;
  this->m_intensity = (data->thread).m_intensity;
  this->m_runner = (IOclRunner *)0x0;
  pOVar1 = OclSharedState::get(0);
  this->m_sharedData = pOVar1;
  memset(&(this->m_job).m_jobs[0].m_diff,0,0x99);
  memset(&(this->m_job).m_jobs[1].m_diff,0,0x99);
  memset(&this->m_job,0,0x15c);
  (this->m_job).m_jobs[0].m_extraIters = 0;
  (this->m_job).m_jobs[1].m_seed.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_seed.m_size = 0;
  (this->m_job).m_jobs[1].m_size = 0;
  (this->m_job).m_jobs[1].m_clientId.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_clientId.m_size = 0;
  (this->m_job).m_jobs[1].m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_extraNonce.m_size = 0;
  (this->m_job).m_jobs[1].m_backend = 0;
  (this->m_job).m_jobs[1].m_id.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_id.m_size = 0;
  (this->m_job).m_jobs[1].m_poolWallet.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_poolWallet.m_size = 0;
  (this->m_job).m_jobs[1].m_extraIters = 0;
  (this->m_job).m_rounds[0] = 0;
  (this->m_job).m_rounds[1] = 0;
  *(undefined8 *)((long)(this->m_job).m_rounds + 1) = 0;
  *(undefined8 *)((long)&(this->m_job).m_sequence + 1) = 0;
  this_00 = (OclCnRunner *)operator_new(0x110);
  OclCnRunner::OclCnRunner(this_00,id,data);
  this->m_runner = (IOclRunner *)this_00;
  (*(this_00->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner[0xb])(this_00);
  (*this->m_runner->_vptr_IOclRunner[10])();
  return;
}

Assistant:

xmrig::OclWorker::OclWorker(size_t id, const OclLaunchData &data) :
    Worker(id, data.affinity, -1),
    m_miner(data.miner),
    m_intensity(data.thread.intensity()),
    m_sharedData(OclSharedState::get(data.device.index()))
{

    m_runner = new OclCnRunner(id, data);
        if (!m_runner) {
            return;
    }

    try {
        m_runner->init();
        m_runner->build();
    }
    catch (std::exception &ex) {
        printError(id, ex.what());

        delete m_runner;
        m_runner = nullptr;
    }
}